

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O3

bool kj::_::expectFatalThrow
               (Maybe<kj::Exception::Type> *type,Maybe<kj::StringPtr> *message,
               Function<void_()> *code)

{
  bool bVar1;
  __pid_t __pid;
  int iVar2;
  __pid_t _Var3;
  Exception *e;
  anon_union_4_1_a8c68091_for_NullableValue<kj::Exception::Type>_2 aVar4;
  bool bVar5;
  FatalThrowExpectation expectation;
  Fault f;
  int status;
  ExceptionCallback local_558;
  char local_548;
  anon_union_4_1_a8c68091_for_NullableValue<kj::Exception::Type>_2 local_544;
  char local_540;
  undefined4 local_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  Exception EStack_4f0;
  Fault local_360 [51];
  uint local_1c8 [102];
  
  do {
    __pid = fork();
    if (-1 < __pid) {
      if (__pid == 0) {
        bVar5 = (type->ptr).isSet;
        aVar4.value = FAILED;
        if (bVar5 == true) {
          aVar4 = (type->ptr).field_1;
        }
        bVar1 = (message->ptr).isSet;
        if (bVar1 == true) {
          local_508 = *(undefined8 *)&(message->ptr).field_1;
          uStack_500 = *(undefined8 *)((long)&(message->ptr).field_1 + 8);
        }
        ExceptionCallback::ExceptionCallback(&local_558);
        local_558._vptr_ExceptionCallback = (_func_int **)&PTR__FatalThrowExpectation_006e39a0;
        if (bVar5 != false) {
          local_544 = aVar4;
        }
        if (bVar1 != false) {
          local_538 = (undefined4)local_508;
          uStack_534 = local_508._4_4_;
          uStack_530 = (undefined4)uStack_500;
          uStack_52c = uStack_500._4_4_;
        }
        local_548 = bVar5;
        local_540 = bVar1;
        (**((code->impl).ptr)->_vptr_Iface)();
        local_4f8 = local_4f8 & 0xffffffffffffff00;
        if (Debug::minSeverity < 3) {
          Debug::log<char_const(&)[30]>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                     ,0x71,ERROR,"\"no fatal exception was thrown\"",
                     (char (*) [30])"no fatal exception was thrown");
        }
        if ((char)local_4f8 == '\x01') {
          Exception::~Exception(&EStack_4f0);
        }
        local_558._vptr_ExceptionCallback = (_func_int **)&PTR__FatalThrowExpectation_006e39a0;
        ExceptionCallback::~ExceptionCallback(&local_558);
        _exit(1);
      }
      goto LAB_004b85fc;
    }
    iVar2 = Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_360[0].exception = (Exception *)0x0;
    local_4f8 = 0;
    EStack_4f0.ownFile.content.ptr = (char *)0x0;
    Debug::Fault::init(local_360,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                      );
    Debug::Fault::fatal(local_360);
  }
LAB_004b85fc:
  do {
    _Var3 = waitpid(__pid,(int *)local_1c8,0);
    if (-1 < _Var3) goto LAB_004b8628;
    iVar2 = Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_360[0].exception = (Exception *)0x0;
    local_4f8 = 0;
    EStack_4f0.ownFile.content.ptr = (char *)0x0;
    Debug::Fault::init(local_360,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                      );
    Debug::Fault::fatal(local_360);
  }
LAB_004b8628:
  if ((local_1c8[0] & 0x7f) == 0) {
    bVar5 = (local_1c8[0] & 0xff00) == 0;
  }
  else {
    if ((int)((local_1c8[0] & 0x7f) * 0x1000000 + 0x1000000) < 0x2000000) {
      if (Debug::minSeverity < 3) {
        Debug::log<char_const(&)[39],int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                   ,0x7e,ERROR,"\"subprocess neither exited nor crashed?\", status",
                   (char (*) [39])"subprocess neither exited nor crashed?",(int *)local_1c8);
      }
    }
    else if (Debug::minSeverity < 3) {
      local_4f8 = CONCAT44(local_4f8._4_4_,local_1c8[0]) & 0xffffffff0000007f;
      Debug::log<char_const(&)[46],int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                 ,0x7b,ERROR,"\"subprocess crashed without throwing exception\", WTERMSIG(status)",
                 (char (*) [46])"subprocess crashed without throwing exception",(int *)&local_4f8);
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool expectFatalThrow(kj::Maybe<Exception::Type> type, kj::Maybe<StringPtr> message,
                      Function<void()> code) {
#if _WIN32
  // We don't support death tests on Windows due to lack of efficient fork.
  return true;
#else
  pid_t child;
  KJ_SYSCALL(child = fork());
  if (child == 0) {
    KJ_DEFER(_exit(1));
    FatalThrowExpectation expectation(type, message);
    KJ_IF_SOME(e, kj::runCatchingExceptions([&]() {
      code();
    })) {
      KJ_LOG(ERROR, "a non-fatal exception was thrown, but we expected fatal", e);
    } else {
      KJ_LOG(ERROR, "no fatal exception was thrown");
    }
  }

  int status;
  KJ_SYSCALL(waitpid(child, &status, 0));

  if (WIFEXITED(status)) {
    return WEXITSTATUS(status) == 0;
  } else if (WIFSIGNALED(status)) {
    KJ_FAIL_EXPECT("subprocess crashed without throwing exception", WTERMSIG(status));
    return false;
  } else {
    KJ_FAIL_EXPECT("subprocess neither exited nor crashed?", status);
    return false;
  }
#endif
}